

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O3

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::icdf_
          (result_type_conflict3 *__return_storage_ptr__,snedecor_f_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *__return_storage_ptr___00;
  longdouble in_ST0;
  longdouble x_00;
  longdouble y;
  
  x_00 = (longdouble)0.5 * (longdouble)*(int *)__return_storage_ptr__;
  y = (longdouble)0.5 * (longdouble)*(int *)((long)__return_storage_ptr__ + 4);
  __return_storage_ptr___00 = __return_storage_ptr__;
  math::detail::Beta<long_double>((longdouble *)__return_storage_ptr__,x_00,y);
  math::detail::inv_Beta_I<long_double>
            ((longdouble *)__return_storage_ptr___00,x._0_10_,x_00,y,in_ST0);
  return (result_type_conflict3 *)(ulong)*(uint *)__return_storage_ptr__;
}

Assistant:

icdf_(result_type x) const {
      const result_type t{math::inv_Beta_I(x, result_type(1) / result_type(2) * P.n(),
                                           result_type(1) / result_type(2) * P.m())};
      return t / (1 - t) * static_cast<result_type>(P.m()) / static_cast<result_type>(P.n());
    }